

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turn.cpp
# Opt level: O3

bool __thiscall Turn::addNurse(Turn *this,NurseSolution *nurse)

{
  pointer *pppNVar1;
  iterator __position;
  __normal_iterator<NurseSolution_**,_std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>_>
  _Var2;
  NurseSolution *local_30;
  NurseSolution *local_28;
  
  local_30 = nurse;
  local_28 = nurse;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<NurseSolution**,std::vector<NurseSolution*,std::allocator<NurseSolution*>>>,__gnu_cxx::__ops::_Iter_equals_val<NurseSolution_const*const>>
                    ((this->nurses).
                     super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->nurses).
                     super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (_Var2._M_current ==
        (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<NurseSolution*,std::allocator<NurseSolution*>>::
      _M_realloc_insert<NurseSolution*const&>
                ((vector<NurseSolution*,std::allocator<NurseSolution*>> *)&this->nurses,__position,
                 &local_30);
      nurse = local_30;
    }
    else {
      *__position._M_current = nurse;
      pppNVar1 = &(this->nurses).
                  super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    NurseSolution::addTurn(nurse,this);
  }
  return _Var2._M_current == __position._M_current;
}

Assistant:

bool Turn::addNurse(NurseSolution * nurse){
    if(!hasNurse(nurse)) {
        nurses.push_back(nurse);
        nurse->addTurn(this);
        return true;
    }
    return false;
}